

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O3

int32_t __thiscall
icu_63::GregorianCalendar::handleComputeMonthStart
          (GregorianCalendar *this,int32_t eyear,int32_t month,UBool param_3)

{
  long numerator;
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  int64_t iVar5;
  int64_t iVar6;
  int16_t *piVar7;
  int64_t y;
  bool bVar8;
  int32_t local_2c;
  
  local_2c = month;
  if (0xb < (uint)month) {
    iVar3 = ClockMath::floorDivide((double)month,0xc,&local_2c);
    eyear = eyear + iVar3;
  }
  bVar8 = (eyear & 3U) == 0;
  numerator = (long)eyear + -1;
  iVar5 = ClockMath::floorDivide(numerator,4);
  iVar1 = this->fGregorianCutoverYear;
  this->fIsGregorian = iVar1 <= eyear;
  bVar2 = iVar1 <= eyear;
  if (this->fInvertGregorian != '\0') {
    bVar2 = eyear < iVar1;
    this->fIsGregorian = eyear < iVar1;
  }
  iVar3 = eyear * 0x16d + (int)iVar5 + 0x1a42e2;
  if (bVar2) {
    if ((eyear & 3U) == 0) {
      uVar4 = eyear * -0x3d70a3d7 + 0x51eb850;
      bVar8 = true;
      if ((uVar4 >> 2 | eyear * 0x40000000) < 0x28f5c29) {
        bVar8 = (uVar4 >> 4 | eyear * -0x70000000) < 0xa3d70b;
      }
    }
    else {
      bVar8 = false;
    }
    iVar5 = ClockMath::floorDivide(numerator,400);
    iVar6 = ClockMath::floorDivide(numerator,100);
    iVar3 = iVar3 + ((int)iVar5 - (int)iVar6) + 2;
  }
  if ((long)local_2c != 0) {
    piVar7 = kLeapNumDays;
    if (!bVar8) {
      piVar7 = kNumDays;
    }
    iVar3 = iVar3 + piVar7[local_2c];
  }
  return iVar3;
}

Assistant:

int32_t GregorianCalendar::handleComputeMonthStart(int32_t eyear, int32_t month,

                                                   UBool /* useMonth */) const
{
    GregorianCalendar *nonConstThis = (GregorianCalendar*)this; // cast away const

    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        eyear += ClockMath::floorDivide(month, 12, month);
    }

    UBool isLeap = eyear%4 == 0;
    int64_t y = (int64_t)eyear-1;
    int64_t julianDay = 365*y + ClockMath::floorDivide(y, (int64_t)4) + (kJan1_1JulianDay - 3);

    nonConstThis->fIsGregorian = (eyear >= fGregorianCutoverYear);
#if defined (U_DEBUG_CAL)
    fprintf(stderr, "%s:%d: (hcms%d/%d) fIsGregorian %s, fInvertGregorian %s\n", 
        __FILE__, __LINE__, eyear,month, fIsGregorian?"T":"F", fInvertGregorian?"T":"F");
#endif
    if (fInvertGregorian) {
        nonConstThis->fIsGregorian = !fIsGregorian;
    }
    if (fIsGregorian) {
        isLeap = isLeap && ((eyear%100 != 0) || (eyear%400 == 0));
        // Add 2 because Gregorian calendar starts 2 days after
        // Julian calendar
        int32_t gregShift = Grego::gregorianShift(eyear);
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: (hcms%d/%d) gregorian shift of %d += %d\n", 
            __FILE__, __LINE__, eyear, month, julianDay, gregShift);
#endif
        julianDay += gregShift;
    }

    // At this point julianDay indicates the day BEFORE the first
    // day of January 1, <eyear> of either the Julian or Gregorian
    // calendar.

    if (month != 0) {
        julianDay += isLeap?kLeapNumDays[month]:kNumDays[month];
    }

    return static_cast<int32_t>(julianDay);
}